

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O2

void __thiscall pg::FPJSolver::runSeq(FPJSolver *this)

{
  uint uVar1;
  uint uVar2;
  Game *pGVar3;
  bitset *pbVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  ostream *poVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  int v;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int *curedge;
  ulong uVar15;
  ulong uVar16;
  uint *puVar17;
  bool bVar18;
  int v_1;
  ulong uVar19;
  uint local_c0;
  uint local_bc;
  _label_vertex local_b8;
  uintqueue Q;
  bitset parity;
  bitset justified;
  bitset distraction;
  
  uVar13 = ((this->super_Solver).game)->n_vertices;
  pvVar7 = operator_new__(-(ulong)(uVar13 >> 0x3e != 0) | uVar13 * 4);
  bitset::bitset(&justified,uVar13);
  bitset::bitset(&distraction,((this->super_Solver).game)->n_vertices);
  bitset::bitset(&parity,((this->super_Solver).game)->n_vertices);
  pGVar3 = (this->super_Solver).game;
  for (uVar13 = 0; uVar15 = pGVar3->n_vertices, (long)uVar13 < (long)uVar15; uVar13 = uVar13 + 1) {
    uVar15 = uVar13 >> 6;
    uVar16 = 1L << (uVar13 & 0x3f);
    if ((*(byte *)(pGVar3->_priority + uVar13) & 1) == 0) {
      uVar16 = ~uVar16 & parity._bits[uVar15];
    }
    else {
      uVar16 = uVar16 | parity._bits[uVar15];
    }
    parity._bits[uVar15] = uVar16;
  }
  Q.pointer = 0;
  Q.queue = (uint *)operator_new__((uVar15 & 0xffffffff) << 2);
  local_bc = 0;
  bVar18 = false;
  uVar6 = 0;
  uVar14 = (uint)*parity._bits & 1;
  do {
    uVar13 = (ulong)(int)uVar6;
    local_c0 = uVar6;
    if (((this->super_Solver).game)->n_vertices == uVar13) {
LAB_00157684:
      if (bVar18) {
        while (lVar11 = (long)Q.pointer, lVar11 != 0) {
          Q.pointer = Q.pointer + -1;
          pGVar3 = (this->super_Solver).game;
          uVar6 = Q.queue[lVar11 + -1];
          puVar17 = (uint *)(pGVar3->_inedges + pGVar3->_firstins[(int)uVar6]);
          puVar9 = Q.queue;
          while( true ) {
            uVar1 = *puVar17;
            uVar13 = (ulong)(int)uVar1;
            if (uVar13 == 0xffffffffffffffff) break;
            uVar15 = uVar13 >> 6;
            if ((((this->super_Solver).disabled)->_bits[uVar15] >> (uVar13 & 0x3f) & 1) == 0) {
              uVar19 = 1L << (uVar13 & 0x3f);
              uVar16 = justified._bits[uVar15];
              if (((uVar16 & uVar19) != 0) &&
                 ((uVar2 = *(uint *)((long)pvVar7 + uVar13 * 4), uVar2 == 0xffffffff ||
                  (uVar2 == uVar6)))) {
                if (1 < (this->super_Solver).trace) {
                  poVar8 = std::operator<<((this->super_Solver).logger,"\x1b[31;1mresetting\x1b[m ")
                  ;
                  local_b8.g = (this->super_Solver).game;
                  local_b8.v = uVar1;
                  poVar8 = operator<<(poVar8,&local_b8);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  uVar16 = justified._bits[uVar15];
                  puVar9 = Q.queue;
                }
                justified._bits[uVar15] = ~uVar19 & uVar16;
                distraction._bits[uVar15] = distraction._bits[uVar15] & ~uVar19;
                lVar11 = (long)Q.pointer;
                Q.pointer = Q.pointer + 1;
                puVar9[lVar11] = uVar1;
                if ((int)uVar1 < (int)local_c0) {
                  local_c0 = uVar1;
                }
              }
            }
            puVar17 = puVar17 + 1;
          }
        }
        if ((this->super_Solver).trace != 0) {
          poVar8 = std::operator<<((this->super_Solver).logger,
                                   "restarting after finding distractions of prio ");
          poVar8 = (ostream *)
                   std::ostream::operator<<
                             (poVar8,((this->super_Solver).game)->_priority
                                     [(long)(int)local_c0 + -1]);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        this->iterations = this->iterations + 1;
        uVar6 = local_bc;
        if ((int)local_c0 < (int)local_bc) {
          uVar6 = local_c0;
        }
        uVar13 = (ulong)(int)uVar6;
      }
      else {
        for (uVar15 = (ulong)(int)local_bc; (long)uVar15 < (long)uVar13; uVar15 = uVar15 + 1) {
          uVar16 = uVar15 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar16] >> (uVar15 & 0x3f) & 1) == 0) {
            uVar19 = 1L << (uVar15 & 0x3f);
            if (((justified._bits[uVar16] & uVar19) == 0) &&
               (justified._bits[uVar16] = justified._bits[uVar16] | uVar19,
               1 < (this->super_Solver).trace)) {
              poVar8 = std::operator<<((this->super_Solver).logger,
                                       "\x1b[38;5;165;1mjustified\x1b[m ");
              local_b8.g = (this->super_Solver).game;
              local_b8.v = (int)uVar15;
              operator<<(poVar8,&local_b8);
              uVar1 = *(uint *)((long)pvVar7 + uVar15 * 4);
              if (uVar1 != 0xffffffff) {
                poVar8 = std::operator<<((this->super_Solver).logger," => ");
                local_b8.g = (this->super_Solver).game;
                local_b8.v = uVar1;
                operator<<(poVar8,&local_b8);
              }
              std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
            }
          }
        }
      }
      if (((this->super_Solver).game)->n_vertices == uVar13) {
        for (uVar13 = 0; (long)uVar13 < ((this->super_Solver).game)->n_vertices; uVar13 = uVar13 + 1
            ) {
          uVar15 = uVar13 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar15] >> (uVar13 & 0x3f) & 1) == 0) {
            uVar19 = 1L << (uVar13 & 0x3f);
            uVar16 = parity._bits[uVar15];
            uVar15 = distraction._bits[uVar15];
            uVar14 = Solver::owner(&this->super_Solver,(int)uVar13);
            iVar5 = -1;
            uVar12 = (uint)(((uVar16 & uVar19) != 0) != ((uVar15 & uVar19) != 0));
            if (uVar14 == uVar12) {
              iVar5 = *(int *)((long)pvVar7 + uVar13 * 4);
            }
            Solver::solve(&this->super_Solver,(int)uVar13,uVar12,iVar5);
          }
        }
        operator_delete__(pvVar7);
        poVar8 = std::operator<<((this->super_Solver).logger,"solved with ");
        poVar8 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar8);
        poVar8 = std::operator<<(poVar8," iterations.");
        std::endl<char,std::char_traits<char>>(poVar8);
        uintqueue::~uintqueue(&Q);
        bitset::~bitset(&parity);
        bitset::~bitset(&distraction);
        bitset::~bitset(&justified);
        return;
      }
      uVar15 = uVar13 >> 6;
      uVar16 = 1L << (uVar13 & 0x3f);
      uVar14 = (uint)((parity._bits[uVar15] >> (uVar13 & 0x3f) & 1) != 0);
      bVar18 = false;
      local_c0 = uVar6;
      local_bc = uVar6;
LAB_0015791b:
      if ((justified._bits[uVar15] & uVar16) == 0) {
        iVar5 = Solver::owner(&this->super_Solver,local_c0);
        pGVar3 = (this->super_Solver).game;
        pbVar4 = (this->super_Solver).disabled;
        puVar9 = (uint *)(pGVar3->_outedges + pGVar3->_firstouts[uVar13]);
        if (iVar5 == 0) {
          while( true ) {
            uVar6 = *puVar9;
            uVar19 = (ulong)(int)uVar6;
            if (uVar19 == 0xffffffffffffffff) break;
            uVar10 = uVar19 >> 6;
            if (((pbVar4->_bits[uVar10] >> (uVar19 & 0x3f) & 1) == 0) &&
               (uVar19 = 1L << (uVar19 & 0x3f),
               ((parity._bits[uVar10] & uVar19) != 0) == ((distraction._bits[uVar10] & uVar19) != 0)
               )) {
              uVar12 = 0;
              goto LAB_001579f2;
            }
            puVar9 = puVar9 + 1;
          }
          uVar12 = 1;
        }
        else {
          while( true ) {
            uVar6 = *puVar9;
            uVar19 = (ulong)(int)uVar6;
            if (uVar19 == 0xffffffffffffffff) break;
            uVar10 = uVar19 >> 6;
            if (((pbVar4->_bits[uVar10] >> (uVar19 & 0x3f) & 1) == 0) &&
               (uVar19 = 1L << (uVar19 & 0x3f),
               ((distraction._bits[uVar10] & uVar19) != 0) != ((parity._bits[uVar10] & uVar19) != 0)
               )) {
              uVar12 = 1;
              goto LAB_001579f2;
            }
            puVar9 = puVar9 + 1;
          }
          uVar12 = 0;
        }
        uVar6 = 0xffffffff;
LAB_001579f2:
        *(uint *)((long)pvVar7 + uVar13 * 4) = uVar6;
        if (uVar14 != uVar12) {
          lVar11 = (long)Q.pointer;
          bVar18 = true;
          Q.pointer = Q.pointer + 1;
          Q.queue[lVar11] = local_c0;
          distraction._bits[uVar15] = distraction._bits[uVar15] | uVar16;
          justified._bits[uVar15] = justified._bits[uVar15] | uVar16;
          if (1 < (this->super_Solver).trace) {
            poVar8 = std::operator<<((this->super_Solver).logger,"\x1b[38;5;165;1mjustified*\x1b[m "
                                    );
            local_b8.g = (this->super_Solver).game;
            local_b8.v = local_c0;
            operator<<(poVar8,&local_b8);
            if (uVar6 != 0xffffffff) {
              poVar8 = std::operator<<((this->super_Solver).logger," => ");
              local_b8.g = (this->super_Solver).game;
              local_b8.v = uVar6;
              operator<<(poVar8,&local_b8);
            }
            std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          }
        }
      }
    }
    else {
      uVar15 = uVar13 >> 6;
      if ((((this->super_Solver).disabled)->_bits[uVar15] >> (uVar13 & 0x3f) & 1) == 0) {
        uVar16 = 1L << (uVar13 & 0x3f);
        if (uVar14 != ((parity._bits[uVar15] & uVar16) != 0)) goto LAB_00157684;
        goto LAB_0015791b;
      }
    }
    uVar6 = local_c0 + 1;
  } while( true );
}

Assistant:

void
FPJSolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex
    int blockstart = 0; // first vertex of the current block

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (disabled[from]) continue;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
                if (i > blockstart) i = blockstart;
            } else {
                // We now know that the current strategy of all unjustified vertices of the block is justified
                for (int v=blockstart; v<i; v++) {
                    if (!disabled[v] and !justified[v]) {
                        justified[v] = true;
#ifndef NDEBUG
                        if (trace >= 2) {
                            logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(v);
                            if (strategy[v] != -1) logger << " => " << label_vertex(strategy[v]);
                            logger << std::endl;
                        }
#endif
                    }
                }
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
            blockstart = i;
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) {
            i++;
            continue;
        }

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            justified[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}